

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O2

void __thiscall
tchecker::syncprod::synchronizer_t::synchronizer_t
          (synchronizer_t *this,shared_ptr<const_tchecker::syncprod::system_t> *system,
          string *separator,string *process_name)

{
  element_type *peVar1;
  
  std::__shared_ptr<const_tchecker::syncprod::system_t,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_tchecker::syncprod::system_t,_(__gnu_cxx::_Lock_policy)2> *)this,
             &system->
              super___shared_ptr<const_tchecker::syncprod::system_t,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string((string *)&this->_separator,(string *)separator);
  std::__cxx11::string::string((string *)&this->_process_name,(string *)process_name);
  peVar1 = (this->_system).
           super___shared_ptr<const_tchecker::syncprod::system_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  tchecker::system::system_t::system_t
            (&this->_product,&(peVar1->super_system_t)._name,&(peVar1->super_system_t)._attributes);
  integer_variables(this);
  clock_variables(this);
  process(this);
  locations_edges_events(this);
  return;
}

Assistant:

synchronizer_t(std::shared_ptr<tchecker::syncprod::system_t const> const & system, std::string const & separator,
                 std::string const & process_name)
      : _system(system), _separator(separator), _process_name(process_name), _product(_system->name(), _system->attributes())
  {
    integer_variables();
    clock_variables();
    process();
    locations_edges_events();
  }